

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_qrshl_u32_arm(CPUARMState *env,uint32_t val,uint32_t shiftop)

{
  byte bVar1;
  uint64_t big_dest;
  int8_t shift;
  uint32_t dest;
  uint32_t shiftop_local;
  uint32_t val_local;
  CPUARMState *env_local;
  
  bVar1 = (byte)shiftop;
  if ((char)bVar1 < ' ') {
    if ((char)bVar1 < -0x20) {
      big_dest._4_4_ = 0;
    }
    else if (bVar1 == 0xe0) {
      big_dest._4_4_ = val >> 0x1f;
    }
    else if ((char)bVar1 < '\0') {
      big_dest._4_4_ = (uint)((ulong)val + (1L << (-bVar1 - 1 & 0x3f)) >> (-bVar1 & 0x3f));
    }
    else {
      big_dest._4_4_ = val << (bVar1 & 0x1f);
      if (big_dest._4_4_ >> (bVar1 & 0x1f) != val) {
        (env->vfp).qc[0] = 1;
        big_dest._4_4_ = 0xffffffff;
      }
    }
  }
  else if (val == 0) {
    big_dest._4_4_ = 0;
  }
  else {
    (env->vfp).qc[0] = 1;
    big_dest._4_4_ = 0xffffffff;
  }
  return big_dest._4_4_;
}

Assistant:

uint32_t HELPER(neon_qrshl_u32)(CPUARMState *env, uint32_t val, uint32_t shiftop)
{
    uint32_t dest;
    int8_t shift = (int8_t)shiftop;
    if (shift >= 32) {
        if (val) {
            SET_QC();
            dest = ~0;
        } else {
            dest = 0;
        }
    } else if (shift < -32) {
        dest = 0;
    } else if (shift == -32) {
        dest = val >> 31;
    } else if (shift < 0) {
        uint64_t big_dest = ((uint64_t)val + (1ULL << (-1 - shift)));
        dest = big_dest >> -shift;
    } else {
        dest = val << shift;
        if ((dest >> shift) != val) {
            SET_QC();
            dest = ~0;
        }
    }
    return dest;
}